

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

err_t rngESHealth2(void)

{
  err_t eVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 8) {
      return 0x12f;
    }
    eVar1 = rngESTest((char *)((long)&DAT_0013a344 + (long)*(int *)((long)&DAT_0013a344 + lVar2)));
    lVar2 = lVar2 + 4;
  } while (eVar1 != 0);
  return 0;
}

Assistant:

err_t rngESHealth2()
{
	const char* sources[] = { "trng", "trng2" };
	size_t pos;
	// проверить физические источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESTest(sources[pos]) == ERR_OK)
			return ERR_OK;
	// работоспособные источники не найдены
	return ERR_NOT_ENOUGH_ENTROPY;
}